

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O1

bool __thiscall
crnlib::command_line_params::parse
          (command_line_params *this,char *pCmd_line,uint n,param_desc *pParam_desc,
          bool skip_first_param)

{
  char *pcVar1;
  long lVar2;
  dynamic_string *pdVar3;
  uint uVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  dynamic_string_array p;
  dynamic_string_array local_38;
  
  local_38.m_p = (dynamic_string *)0x0;
  local_38.m_size = 0;
  local_38.m_capacity = 0;
  bVar5 = split_params(pCmd_line,&local_38);
  pdVar3 = local_38.m_p;
  if ((bVar5) && (uVar4 = local_38.m_size, local_38.m_size != 0)) {
    if (skip_first_param) {
      pcVar1 = (local_38.m_p)->m_pStr;
      if ((pcVar1 != (char *)0x0) &&
         ((*(uint *)(pcVar1 + -8) ^ *(uint *)(pcVar1 + -4)) == 0xffffffff)) {
        crnlib_free(pcVar1 + -0x10);
      }
      memmove(pdVar3,pdVar3 + 1,(ulong)(uVar4 - 1) << 4);
      local_38.m_size = local_38.m_size - 1;
    }
    bVar5 = parse(this,&local_38,n,pParam_desc);
  }
  else {
    bVar5 = false;
  }
  pdVar3 = local_38.m_p;
  if (local_38.m_p != (dynamic_string *)0x0) {
    uVar7 = local_38._8_8_ & 0xffffffff;
    if (uVar7 != 0) {
      lVar6 = 0;
      do {
        lVar2 = *(long *)((long)&pdVar3->m_pStr + lVar6);
        if ((lVar2 != 0) && ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff)) {
          crnlib_free((void *)(lVar2 + -0x10));
        }
        lVar6 = lVar6 + 0x10;
      } while (uVar7 << 4 != lVar6);
    }
    crnlib_free(local_38.m_p);
  }
  return bVar5;
}

Assistant:

bool command_line_params::parse(const char* pCmd_line, uint n, const param_desc* pParam_desc, bool skip_first_param)
    {
        CRNLIB_ASSERT(n && pParam_desc);

        dynamic_string_array p;
        if (!split_params(pCmd_line, p))
        {
            return 0;
        }

        if (p.empty())
        {
            return 0;
        }

        if (skip_first_param)
        {
            p.erase(0U);
        }

        return parse(p, n, pParam_desc);
    }